

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O0

err_t bignParamsEnc(octet *der,size_t *count,bign_params *params)

{
  bool_t bVar1;
  bign_params *in_RDX;
  size_t *in_RSI;
  void *in_RDI;
  size_t len;
  bign_params *in_stack_00000128;
  octet *in_stack_00000130;
  size_t local_28;
  
  bVar1 = memIsValid(in_RDX,0x150);
  if (((bVar1 == 0) || (bVar1 = memIsValid(in_RSI,8), bVar1 == 0)) ||
     ((in_RDI != (void *)0x0 && (bVar1 = memIsValid(in_RDI,*in_RSI), bVar1 == 0)))) {
    return 0x6d;
  }
  bVar1 = bignIsOperable(in_RDX);
  if (bVar1 == 0) {
    return 0x1f6;
  }
  local_28 = bignParamsEnc_internal(in_stack_00000130,in_stack_00000128);
  if (local_28 == 0xffffffffffffffff) {
    return 0x1f6;
  }
  if (in_RDI != (void *)0x0) {
    if (*in_RSI < local_28) {
      return 0x6e;
    }
    local_28 = bignParamsEnc_internal(in_stack_00000130,in_stack_00000128);
  }
  *in_RSI = local_28;
  return 0;
}

Assistant:

err_t bignParamsEnc(octet der[], size_t* count, const bign_params* params)
{
	size_t len;
	if (!memIsValid(params, sizeof(bign_params)) ||
		!memIsValid(count, O_PER_S) ||
		!memIsNullOrValid(der, *count))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	len = bignParamsEnc_internal(0, params);
	if (len == SIZE_MAX)
		return ERR_BAD_PARAMS;
	if (der)
	{
		if (*count < len)
			return ERR_OUTOFMEMORY;
		len = bignParamsEnc_internal(der, params);
		ASSERT(len != SIZE_MAX);
	}
	*count = len;
	return ERR_OK;
}